

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::prepareAttributes
          (TextureTestBase *this,GLuint test_case_index,ProgramInterface *program_interface,
          Buffer *buffer,VertexArray *vao)

{
  GLuint GVar1;
  GLuint GVar2;
  Type *pTVar3;
  GLuint GVar4;
  VertexArray *pVVar5;
  int iVar6;
  GLuint GVar7;
  size_type sVar8;
  ulong uVar9;
  reference ppVVar10;
  int *piVar11;
  Type TVar12;
  Type local_c0;
  Type local_b0;
  Type *local_a0;
  Type *type;
  Variable *variable_1;
  reference pvStack_88;
  GLuint i_1;
  GLubyte *ptr;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_data;
  GLint ends_at;
  GLint variable_size;
  Variable *variable;
  GLuint i;
  GLint vertex_stride;
  ShaderInterface *si;
  VertexArray *pVStack_30;
  bool use_component_qualifier;
  VertexArray *vao_local;
  Buffer *buffer_local;
  ProgramInterface *program_interface_local;
  TextureTestBase *pTStack_10;
  GLuint test_case_index_local;
  TextureTestBase *this_local;
  
  pVStack_30 = vao;
  vao_local = (VertexArray *)buffer;
  buffer_local = (Buffer *)program_interface;
  program_interface_local._4_4_ = test_case_index;
  pTStack_10 = this;
  iVar6 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0x1f]
          )(this,(ulong)test_case_index);
  si._7_1_ = (byte)iVar6 & 1;
  _i = Utils::ProgramInterface::GetShaderInterface((ProgramInterface *)buffer_local,VERTEX);
  Utils::VertexArray::Bind(pVStack_30);
  Utils::Buffer::Bind((Buffer *)vao_local);
  sVar8 = std::
          vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
          ::size(&_i->m_inputs);
  if (sVar8 != 0) {
    variable._4_4_ = 0;
    for (variable._0_4_ = 0; uVar9 = (ulong)(uint)variable,
        sVar8 = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ::size(&_i->m_inputs), uVar9 < sVar8; variable._0_4_ = (uint)variable + 1) {
      ppVVar10 = std::
                 vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                 ::operator[](&_i->m_inputs,(ulong)(uint)variable);
      buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (int)(*ppVVar10)->m_data_size;
      buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           buffer_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + ((*ppVVar10)->m_descriptor).m_offset;
      piVar11 = std::max<int>((int *)((long)&variable + 4),
                              (int *)&buffer_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      variable._4_4_ = *piVar11;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
               (long)variable._4_4_);
    pvStack_88 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    for (variable_1._4_4_ = 0; uVar9 = (ulong)variable_1._4_4_,
        sVar8 = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ::size(&_i->m_inputs), uVar9 < sVar8; variable_1._4_4_ = variable_1._4_4_ + 1) {
      ppVVar10 = std::
                 vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                 ::operator[](&_i->m_inputs,(ulong)variable_1._4_4_);
      type = (Type *)*ppVVar10;
      memcpy(pvStack_88 + (((value_type)type)->m_descriptor).m_offset,((value_type)type)->m_data,
             ((value_type)type)->m_data_size);
      pVVar5 = pVStack_30;
      if ((si._7_1_ & 1) == 0) {
        pTVar3 = type + 9;
        GVar1 = type[1].m_n_rows;
        GVar2 = type[2].m_n_columns;
        GVar4 = type[5].m_n_columns;
        GVar7 = Utils::Variable::GetStride((Variable *)type);
        Utils::VertexArray::Attribute
                  (pVVar5,GVar1,(Type *)&pTVar3->m_n_columns,GVar2,(GLboolean)GVar4,GVar7,
                   (GLvoid *)(ulong)type[5].m_n_rows);
      }
      else if (type[1].m_n_columns == 0) {
        TVar12 = Utils::Type::GetType(type[9].m_n_columns,1,4);
        pVVar5 = pVStack_30;
        local_c0.m_n_rows = TVar12.m_n_rows;
        local_b0.m_n_rows = local_c0.m_n_rows;
        local_c0._0_8_ = TVar12._0_8_;
        local_b0.m_basic_type = local_c0.m_basic_type;
        local_b0.m_n_columns = local_c0.m_n_columns;
        GVar1 = type[1].m_n_rows;
        GVar2 = type[2].m_n_columns;
        GVar4 = type[5].m_n_columns;
        local_a0 = &local_b0;
        GVar7 = Utils::Variable::GetStride((Variable *)type);
        Utils::VertexArray::Attribute
                  (pVVar5,GVar1,&local_b0,GVar2,(GLboolean)GVar4,GVar7,
                   (GLvoid *)(ulong)type[5].m_n_rows);
      }
    }
    Utils::Buffer::Data((Buffer *)vao_local,StaticDraw,(long)variable._4_4_,pvStack_88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  }
  return;
}

Assistant:

void TextureTestBase::prepareAttributes(GLuint test_case_index, Utils::ProgramInterface& program_interface,
										Utils::Buffer& buffer, Utils::VertexArray& vao)
{
	bool use_component_qualifier = useComponentQualifier(test_case_index);

	/* Get shader interface */
	Utils::ShaderInterface& si = program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Bind vao and buffer */
	vao.Bind();
	buffer.Bind();

	/* Skip if there are no input variables in vertex shader */
	if (0 == si.m_inputs.size())
	{
		return;
	}

	/* Calculate vertex stride and check */
	GLint vertex_stride = 0;

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		Utils::Variable& variable = *si.m_inputs[i];

		GLint variable_size = static_cast<GLuint>(variable.m_data_size);

		GLint ends_at = variable_size + variable.m_descriptor.m_offset;

		vertex_stride = std::max(vertex_stride, ends_at);
	}

	/* Prepare buffer data and set up vao */
	std::vector<GLubyte> buffer_data;
	buffer_data.resize(vertex_stride);

	GLubyte* ptr = &buffer_data[0];

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		Utils::Variable& variable = *si.m_inputs[i];

		memcpy(ptr + variable.m_descriptor.m_offset, variable.m_data, variable.m_data_size);

		if (false == use_component_qualifier)
		{
			vao.Attribute(variable.m_descriptor.m_expected_location, variable.m_descriptor.m_builtin,
						  variable.m_descriptor.m_n_array_elements, variable.m_descriptor.m_normalized,
						  variable.GetStride(), (GLvoid*)(intptr_t)variable.m_descriptor.m_offset);
		}
		else if (0 == variable.m_descriptor.m_expected_component)
		{
			/* Components can only be applied to vectors.
			 Assumption that test use all 4 components */
			const Utils::Type& type =
				Utils::Type::GetType(variable.m_descriptor.m_builtin.m_basic_type, 1 /* n_columns */, 4 /* n_rows */);

			vao.Attribute(variable.m_descriptor.m_expected_location, type, variable.m_descriptor.m_n_array_elements,
						  variable.m_descriptor.m_normalized, variable.GetStride(),
						  (GLvoid*)(intptr_t)variable.m_descriptor.m_offset);
		}
	}

	/* Update buffer */
	buffer.Data(Utils::Buffer::StaticDraw, vertex_stride, ptr);
}